

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackScriptFunction.cpp
# Opt level: O3

void __thiscall Js::StackScriptFunction::BoxState::Box(BoxState *this)

{
  Type TVar1;
  Type TVar2;
  code *pcVar3;
  bool bVar4;
  bool bVar5;
  BOOL BVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  ScriptFunction *pSVar10;
  Type this_00;
  InterpreterStackFrame *pIVar11;
  undefined4 extraout_var;
  char16 *pcVar12;
  JavascriptFunction *pJVar13;
  FrameDisplay *pFVar14;
  FunctionBody *pFVar15;
  Type *pTVar16;
  StackScriptFunction *pSVar17;
  ScriptFunction *pSVar18;
  Type TVar19;
  FunctionInfo *pFVar20;
  void **ppvVar21;
  IRecyclerVisitedObject IVar22;
  InterpreterStackFrame IVar23;
  uint index;
  char16_t *pcVar24;
  undefined1 local_170 [8];
  JavascriptStackWalker walker;
  FunctionBody *local_b8;
  char16 debugStringBuffer [42];
  JavascriptFunction *caller;
  ScopeSlots local_50;
  ScopeSlots slots;
  
  bVar5 = false;
  JavascriptStackWalker::JavascriptStackWalker
            ((JavascriptStackWalker *)local_170,this->scriptContext,true,this->returnAddress,false);
  slots.slotArray.ptr = (Type)__tls_get_addr(&PTR_01548f08);
  walker.currentFrame.stackCheckCodeHeight = (size_t)&this->functionObjectToBox;
  while (BVar6 = JavascriptStackWalker::GetCaller
                           ((JavascriptStackWalker *)local_170,
                            (JavascriptFunction **)(debugStringBuffer + 0x28),true), BVar6 != 0) {
    BVar6 = JavascriptFunction::IsScriptFunction(stack0xffffffffffffffa0);
    if (BVar6 != 0) {
      pSVar10 = VarTo<Js::ScriptFunction,Js::JavascriptFunction>(stack0xffffffffffffffa0);
      this_00.ptr = (WriteBarrierPtr<void> *)
                    JavascriptFunction::GetFunctionBody((JavascriptFunction *)pSVar10);
      if ((bVar5) ||
         (local_b8 = (FunctionBody *)this_00.ptr,
         bVar4 = JsUtil::
                 BaseDictionary<Js::FunctionBody_*,_Js::FunctionBody_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                 ::ContainsKey((BaseDictionary<Js::FunctionBody_*,_Js::FunctionBody_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                                *)this,&local_b8), bVar4)) {
        pIVar11 = JavascriptStackWalker::GetCurrentInterpreterFrame
                            ((JavascriptStackWalker *)local_170);
        local_b8 = (FunctionBody *)this_00.ptr;
        bVar4 = JsUtil::
                BaseDictionary<Js::FunctionBody_*,_Js::FunctionBody_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                ::ContainsKey((BaseDictionary<Js::FunctionBody_*,_Js::FunctionBody_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                               *)this,&local_b8);
        if (bVar4) {
          if (pIVar11 == (InterpreterStackFrame *)0x0) {
LAB_00d4e1e9:
            local_50.slotArray.ptr = (Type)(Type)this_00.ptr;
            if ((walker.inlinedFrameCallInfo._0_2_ & 1) == 0) {
              bVar4 = JsUtil::
                      BaseDictionary<Js::FunctionBody_*,_Js::FunctionBody_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                      ::ContainsKey((BaseDictionary<Js::FunctionBody_*,_Js::FunctionBody_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                                     *)this,(FunctionBody **)&local_50);
              pcVar24 = L"Native";
              if (bVar5) {
                pcVar24 = L"Native and Inlinee";
              }
              if (!bVar4) {
                pcVar24 = L"Native for Inlinee";
              }
            }
            else {
              bVar4 = JsUtil::
                      BaseDictionary<Js::FunctionBody_*,_Js::FunctionBody_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                      ::ContainsKey((BaseDictionary<Js::FunctionBody_*,_Js::FunctionBody_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                                     *)this,(FunctionBody **)&local_50);
              pcVar24 = L"Native Inlined (Pending)";
              if (!bVar4) {
                AssertCount = AssertCount + 1;
                Throw::LogAssert();
                *(undefined4 *)slots.slotArray.ptr = 1;
                bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/StackScriptFunction.cpp"
                                            ,0xb4,"(this->NeedBoxFrame(callerFunctionBody))",
                                            "this->NeedBoxFrame(callerFunctionBody)");
                if (!bVar4) goto LAB_00d4eb76;
                *(undefined4 *)slots.slotArray.ptr = 0;
                pcVar24 = L"Native Inlined (Pending)";
              }
            }
          }
          else {
            if (bVar5) {
LAB_00d4e272:
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              *(undefined4 *)slots.slotArray.ptr = 1;
              bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/StackScriptFunction.cpp"
                                          ,0xae,"(!hasInlineeToBox)","!hasInlineeToBox");
              if (!bVar4) goto LAB_00d4eb76;
              *(undefined4 *)slots.slotArray.ptr = 0;
            }
            bVar4 = JavascriptStackWalker::IsBailedOutFromInlinee
                              ((JavascriptStackWalker *)local_170);
            pcVar24 = L"Interpreted from Inlined Bailout (Pending)";
            if (!bVar4) {
              bVar4 = JavascriptStackWalker::IsBailedOutFromFunction
                                ((JavascriptStackWalker *)local_170);
              pcVar24 = L"Interpreted";
              if (bVar4) {
                pcVar24 = L"Interpreted from Bailout";
              }
            }
          }
          uVar7 = FunctionProxy::GetSourceContextId((FunctionProxy *)this_00.ptr);
          pFVar20 = ((Type *)(this_00.ptr + 2))->ptr;
          if (pFVar20 == (FunctionInfo *)0x0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *(undefined4 *)slots.slotArray.ptr = 1;
            bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                        ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
            if (!bVar4) goto LAB_00d4eb76;
            *(undefined4 *)slots.slotArray.ptr = 0;
            pFVar20 = ((Type *)(this_00.ptr + 2))->ptr;
          }
          bVar4 = Phases::IsEnabled((Phases *)&DAT_015bc490,StackFuncPhase,uVar7,pFVar20->functionId
                                   );
          if (bVar4) {
            iVar8 = (*(((ParseableFunctionInfo *)&(this_00.ptr)->ptr)->super_FunctionProxy).
                      super_FinalizableObject.super_IRecyclerVisitedObject.
                      _vptr_IRecyclerVisitedObject[7])();
            pcVar12 = FunctionProxy::GetDebugNumberSet
                                ((FunctionProxy *)this_00.ptr,(wchar (*) [42])&local_b8);
            Output::Print(L"Boxing Frame [%s]: %s %s\n",pcVar24,CONCAT44(extraout_var,iVar8),pcVar12
                         );
            Output::Flush();
          }
          if (pIVar11 == (InterpreterStackFrame *)0x0) goto LAB_00d4e5f6;
          if (bVar5) goto LAB_00d4e3f8;
LAB_00d4e441:
          pJVar13 = GetCurrentFunctionObject(*(JavascriptFunction **)(pIVar11 + 0x80));
          if (pJVar13 != stack0xffffffffffffffa0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *(undefined4 *)slots.slotArray.ptr = 1;
            bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/StackScriptFunction.cpp"
                                        ,0xca,
                                        "(StackScriptFunction::GetCurrentFunctionObject(interpreterFrame->GetJavascriptFunction()) == caller)"
                                        ,
                                        "StackScriptFunction::GetCurrentFunctionObject(interpreterFrame->GetJavascriptFunction()) == caller"
                                       );
            if (!bVar4) goto LAB_00d4eb76;
            *(undefined4 *)slots.slotArray.ptr = 0;
          }
          bVar4 = FunctionBody::DoStackFrameDisplay((FunctionBody *)this_00.ptr);
          if (((bVar4) && (((byte)pIVar11[0xd6] & 1) != 0)) &&
             (pFVar14 = InterpreterStackFrame::GetLocalFrameDisplay(pIVar11),
             pFVar14 != (FrameDisplay *)0x0)) {
            pFVar14 = BoxFrameDisplay(this,pFVar14);
            InterpreterStackFrame::SetLocalFrameDisplay(pIVar11,pFVar14);
          }
          bVar4 = FunctionBody::DoStackScopeSlots((FunctionBody *)this_00.ptr);
          if (((bVar4) && (((byte)pIVar11[0xd6] & 1) != 0)) &&
             (pFVar15 = (FunctionBody *)InterpreterStackFrame::GetLocalClosure(pIVar11),
             pFVar15 != (FunctionBody *)0x0)) {
            Memory::Recycler::WBSetBit((char *)&local_b8);
            local_b8 = pFVar15;
            Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_b8);
            pTVar16 = BoxScopeSlots(this,(Type *)pFVar15,
                                    *(uint *)&(local_b8->super_ParseableFunctionInfo).
                                              super_FunctionProxy.super_FinalizableObject.
                                              super_IRecyclerVisitedObject.
                                              _vptr_IRecyclerVisitedObject);
            InterpreterStackFrame::SetLocalClosure(pIVar11,pTVar16);
          }
          if ((((Type *)(this_00.ptr + 0x15))->ptr != (NestedArray *)0x0) &&
             (TVar2 = ((Type *)(this_00.ptr + 0x15))->ptr->nestedCount, TVar2 != 0)) {
            uVar7 = 0;
            do {
              pSVar17 = InterpreterStackFrame::GetStackNestedFunction(pIVar11,uVar7);
              pSVar18 = BoxStackFunction(this,&pSVar17->super_ScriptFunction);
              if (pSVar17->boxedScriptFunction != pSVar18) {
                AssertCount = AssertCount + 1;
                Throw::LogAssert();
                *(undefined4 *)slots.slotArray.ptr = 1;
                bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/StackScriptFunction.cpp"
                                            ,0xe9,
                                            "(stackFunction->boxedScriptFunction == boxedFunction)",
                                            "stackFunction->boxedScriptFunction == boxedFunction");
                if (!bVar4) goto LAB_00d4eb76;
                *(undefined4 *)slots.slotArray.ptr = 0;
              }
              UpdateFrameDisplay(this,&pSVar17->super_ScriptFunction);
              uVar7 = uVar7 + 1;
            } while (TVar2 != uVar7);
          }
          bVar4 = JavascriptStackWalker::IsBailedOutFromInlinee((JavascriptStackWalker *)local_170);
          if (!bVar4) {
            bVar4 = JavascriptStackWalker::IsBailedOutFromFunction
                              ((JavascriptStackWalker *)local_170);
            if (bVar4) {
              BoxNativeFrame(this,(JavascriptStackWalker *)local_170,(FunctionBody *)this_00.ptr);
              if (((((Type *)(this_00.ptr + 0x15))->ptr != (NestedArray *)0x0) &&
                  (((Type *)(this_00.ptr + 0x15))->ptr->nestedCount != 0)) &&
                 ((walker.inlinedFrameCallInfo._0_2_ & 1) == 0)) {
                ppvVar21 = JavascriptStackWalker::GetCurrentArgv((JavascriptStackWalker *)local_170)
                ;
                IVar22._vptr_IRecyclerVisitedObject =
                     *(_func_int ***)
                      ((long)ppvVar21 +
                      ((ulong)(*(Type *)(this_00.ptr + 10) == 0) << 3 | 0xffffffffffffffe0));
                while (IVar22._vptr_IRecyclerVisitedObject != (_func_int **)0x0) {
                  pSVar17 = VarTo<Js::StackScriptFunction>(IVar22._vptr_IRecyclerVisitedObject);
                  UpdateFrameDisplay(this,&pSVar17->super_ScriptFunction);
                  IVar22._vptr_IRecyclerVisitedObject =
                       pSVar17[1].super_ScriptFunction.super_ScriptFunctionBase.
                       super_JavascriptFunction.super_DynamicObject.super_RecyclableObject.
                       super_FinalizableObject.super_IRecyclerVisitedObject.
                       _vptr_IRecyclerVisitedObject;
                }
              }
            }
            goto LAB_00d4e9a3;
          }
          bVar4 = JavascriptStackWalker::IsCurrentPhysicalFrameForLoopBody
                            ((JavascriptStackWalker *)local_170);
        }
        else {
          if (bVar5) {
            if ((walker.inlinedFrameCallInfo._0_2_ & 1) == 0) {
              if (pIVar11 != (InterpreterStackFrame *)0x0) goto LAB_00d4e272;
              goto LAB_00d4e1e9;
            }
            if (pIVar11 == (InterpreterStackFrame *)0x0) goto LAB_00d4e5f6;
LAB_00d4e3f8:
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *(undefined4 *)slots.slotArray.ptr = 1;
            bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/StackScriptFunction.cpp"
                                        ,200,"(!hasInlineeToBox)","!hasInlineeToBox");
            if (bVar4) {
              *(undefined4 *)slots.slotArray.ptr = 0;
              goto LAB_00d4e441;
            }
            goto LAB_00d4eb76;
          }
          if (pIVar11 != (InterpreterStackFrame *)0x0) goto LAB_00d4e441;
LAB_00d4e5f6:
          if ((walker.inlinedFrameCallInfo._0_2_ & 1) == 0) {
            bVar5 = FunctionBody::DoStackFrameDisplay((FunctionBody *)this_00.ptr);
            if (bVar5) {
              TVar1 = *(Type *)(this_00.ptr + 10);
              ppvVar21 = JavascriptStackWalker::GetCurrentArgv((JavascriptStackWalker *)local_170);
              if ((FrameDisplay *)ppvVar21[(ulong)(TVar1 == 0) - 5] != (FrameDisplay *)0x0) {
                BoxFrameDisplay(this,(FrameDisplay *)ppvVar21[(ulong)(TVar1 == 0) - 5]);
              }
            }
            bVar5 = FunctionBody::DoStackScopeSlots((FunctionBody *)this_00.ptr);
            if (bVar5) {
              TVar1 = *(Type *)(this_00.ptr + 10);
              ppvVar21 = JavascriptStackWalker::GetCurrentArgv((JavascriptStackWalker *)local_170);
              pFVar15 = *(FunctionBody **)
                         ((long)ppvVar21 + ((ulong)(TVar1 == 0) << 3 | 0xffffffffffffffd0));
              if (pFVar15 != (FunctionBody *)0x0) {
                Memory::Recycler::WBSetBit((char *)&local_b8);
                local_b8 = pFVar15;
                Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_b8);
                BoxScopeSlots(this,(Type *)pFVar15,
                              *(uint *)&(local_b8->super_ParseableFunctionInfo).super_FunctionProxy.
                                        super_FinalizableObject.super_IRecyclerVisitedObject.
                                        _vptr_IRecyclerVisitedObject);
              }
            }
            BoxNativeFrame(this,(JavascriptStackWalker *)local_170,(FunctionBody *)this_00.ptr);
            if (((((Type *)(this_00.ptr + 0x15))->ptr != (NestedArray *)0x0) &&
                (((Type *)(this_00.ptr + 0x15))->ptr->nestedCount != 0)) &&
               ((walker.inlinedFrameCallInfo._0_2_ & 1) == 0)) {
              ppvVar21 = JavascriptStackWalker::GetCurrentArgv((JavascriptStackWalker *)local_170);
              IVar22._vptr_IRecyclerVisitedObject =
                   *(_func_int ***)
                    ((long)ppvVar21 +
                    ((ulong)(*(Type *)(this_00.ptr + 10) == 0) << 3 | 0xffffffffffffffe0));
              if (IVar22._vptr_IRecyclerVisitedObject != (_func_int **)0x0) {
                do {
                  pSVar17 = VarTo<Js::StackScriptFunction>(IVar22._vptr_IRecyclerVisitedObject);
                  UpdateFrameDisplay(this,&pSVar17->super_ScriptFunction);
                  IVar22._vptr_IRecyclerVisitedObject =
                       pSVar17[1].super_ScriptFunction.super_ScriptFunctionBase.
                       super_JavascriptFunction.super_DynamicObject.super_RecyclableObject.
                       super_FinalizableObject.super_IRecyclerVisitedObject.
                       _vptr_IRecyclerVisitedObject;
                  bVar5 = false;
                } while (IVar22._vptr_IRecyclerVisitedObject != (_func_int **)0x0);
                goto LAB_00d4e9a3;
              }
            }
            bVar5 = false;
            goto LAB_00d4e9a3;
          }
          bVar4 = JavascriptStackWalker::IsCurrentPhysicalFrameForLoopBody
                            ((JavascriptStackWalker *)local_170);
        }
        if (bVar4 == false) {
          bVar5 = true;
        }
      }
      else {
        bVar4 = FunctionBody::DoStackFrameDisplay((FunctionBody *)this_00.ptr);
        if ((bVar4) && ((walker.inlinedFrameCallInfo._0_2_ & 1) == 0)) {
          pIVar11 = JavascriptStackWalker::GetCurrentInterpreterFrame
                              ((JavascriptStackWalker *)local_170);
          if (pIVar11 == (InterpreterStackFrame *)0x0) {
            ppvVar21 = JavascriptStackWalker::GetCurrentArgv((JavascriptStackWalker *)local_170);
            pFVar14 = (FrameDisplay *)ppvVar21[(ulong)(*(Type *)(this_00.ptr + 10) == 0) - 5];
            IVar23 = (InterpreterStackFrame)0x1;
          }
          else {
            pFVar14 = InterpreterStackFrame::GetLocalFrameDisplay(pIVar11);
            IVar23 = pIVar11[0xd6];
          }
          bVar4 = ThreadContext::IsOnStack(pFVar14);
          if (((byte)IVar23 & bVar4) == 1) {
            if (pFVar14->length == 0) {
              uVar9 = 0;
              index = 0;
            }
            else {
              index = 0;
              do {
                TVar19.ptr = (WriteBarrierPtr<void> *)FrameDisplay::GetItem(pFVar14,index);
                if (((FunctionBody *)TVar19.ptr != (FunctionBody *)0x0) &&
                   ((((ParseableFunctionInfo *)&(TVar19.ptr)->ptr)->super_FunctionProxy).
                    super_FinalizableObject.super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject < (_func_int **)0x10000)) {
                  Memory::Recycler::WBSetBit((char *)&local_50);
                  local_50.slotArray.ptr = (Type)(Type)TVar19.ptr;
                  Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_50);
                  bVar4 = ScopeSlots::IsDebuggerScopeSlotArray(&local_50);
                  if (!bVar4) {
                    pFVar20 = ScopeSlots::GetFunctionInfo(&local_50);
                    pFVar15 = (FunctionBody *)(pFVar20->functionBodyImpl).ptr;
                    bVar4 = FunctionProxy::IsFunctionBody((FunctionProxy *)pFVar15);
                    if (bVar4) {
                      bVar4 = FunctionProxy::IsFunctionBody((FunctionProxy *)pFVar15);
                      if (!bVar4) {
                        AssertCount = AssertCount + 1;
                        Throw::LogAssert();
                        *(undefined4 *)slots.slotArray.ptr = 1;
                        bVar4 = Throw::ReportAssert(
                                                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                                  ,0x59e,"(IsFunctionBody())","IsFunctionBody()");
                        if (!bVar4) goto LAB_00d4eb76;
                        *(undefined4 *)slots.slotArray.ptr = 0;
                      }
                      local_b8 = pFVar15;
                      bVar4 = JsUtil::
                              BaseDictionary<Js::FunctionBody_*,_Js::FunctionBody_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                              ::ContainsKey((BaseDictionary<Js::FunctionBody_*,_Js::FunctionBody_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                                             *)this,&local_b8);
                      if (bVar4) {
                        uVar9 = (uint)pFVar14->length;
                        break;
                      }
                    }
                  }
                }
                index = index + 1;
                uVar9 = (uint)pFVar14->length;
              } while (index < pFVar14->length);
            }
            for (; index < uVar9; index = index + 1) {
              pFVar15 = (FunctionBody *)FrameDisplay::GetItem(pFVar14,index);
              if ((pFVar15 != (FunctionBody *)0x0) &&
                 ((pFVar15->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject
                  .super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject < (_func_int **)0x10000
                 )) {
                Memory::Recycler::WBSetBit((char *)&local_b8);
                local_b8 = pFVar15;
                Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_b8);
                pTVar16 = BoxScopeSlots(this,(Type *)pFVar15,
                                        *(uint *)&(local_b8->super_ParseableFunctionInfo).
                                                  super_FunctionProxy.super_FinalizableObject.
                                                  super_IRecyclerVisitedObject.
                                                  _vptr_IRecyclerVisitedObject);
                FrameDisplay::SetItem(pFVar14,index,pTVar16);
              }
              uVar9 = (uint)pFVar14->length;
            }
          }
        }
      }
LAB_00d4e9a3:
      local_b8 = (FunctionBody *)ScriptFunction::GetFunctionProxy(pSVar10);
      bVar4 = JsUtil::
              BaseDictionary<Js::FunctionProxy_*,_Js::FunctionProxy_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
              ::ContainsKey((BaseDictionary<Js::FunctionProxy_*,_Js::FunctionProxy_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                             *)walker.currentFrame.stackCheckCodeHeight,(FunctionProxy **)&local_b8)
      ;
      if ((bVar4) && (bVar4 = ThreadContext::IsOnStack(pSVar10), bVar4)) {
        pSVar17 = VarTo<Js::StackScriptFunction,Js::ScriptFunction>(pSVar10);
        pSVar10 = BoxStackFunction(this,&pSVar17->super_ScriptFunction);
        JavascriptStackWalker::SetCurrentFunction
                  ((JavascriptStackWalker *)local_170,(JavascriptFunction *)pSVar10);
        pIVar11 = JavascriptStackWalker::GetCurrentInterpreterFrame
                            ((JavascriptStackWalker *)local_170);
        if (pIVar11 != (InterpreterStackFrame *)0x0) {
          InterpreterStackFrame::SetExecutingStackFunction(pIVar11,pSVar10);
        }
        if (((((Type *)(this_00.ptr + 0x15))->ptr != (NestedArray *)0x0) &&
            (((Type *)(this_00.ptr + 0x15))->ptr->nestedCount != 0)) &&
           ((*(Type *)(this_00.ptr + 9) & Flags_StackNestedFunc) != Flags_None)) {
          pIVar11 = JavascriptStackWalker::GetCurrentInterpreterFrame
                              ((JavascriptStackWalker *)local_170);
          if (pIVar11 == (InterpreterStackFrame *)0x0) {
            if ((walker.inlinedFrameCallInfo._0_2_ & 1) == 0) {
              ppvVar21 = JavascriptStackWalker::GetCurrentArgv((JavascriptStackWalker *)local_170);
              IVar22._vptr_IRecyclerVisitedObject =
                   *(_func_int ***)
                    ((long)ppvVar21 +
                    ((ulong)(*(Type *)(this_00.ptr + 10) == 0) << 3 | 0xffffffffffffffe0));
              while (IVar22._vptr_IRecyclerVisitedObject != (_func_int **)0x0) {
                pSVar17 = VarTo<Js::StackScriptFunction>(IVar22._vptr_IRecyclerVisitedObject);
                UpdateFrameDisplay(this,&pSVar17->super_ScriptFunction);
                IVar22._vptr_IRecyclerVisitedObject =
                     pSVar17[1].super_ScriptFunction.super_ScriptFunctionBase.
                     super_JavascriptFunction.super_DynamicObject.super_RecyclableObject.
                     super_FinalizableObject.super_IRecyclerVisitedObject.
                     _vptr_IRecyclerVisitedObject;
              }
            }
          }
          else if ((((Type *)(this_00.ptr + 0x15))->ptr != (NestedArray *)0x0) &&
                  (TVar2 = ((Type *)(this_00.ptr + 0x15))->ptr->nestedCount, TVar2 != 0)) {
            uVar7 = 0;
            do {
              pSVar17 = InterpreterStackFrame::GetStackNestedFunction(pIVar11,uVar7);
              UpdateFrameDisplay(this,&pSVar17->super_ScriptFunction);
              uVar7 = uVar7 + 1;
            } while (TVar2 != uVar7);
          }
        }
      }
    }
  }
  if (bVar5) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    *(undefined4 *)slots.slotArray.ptr = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/StackScriptFunction.cpp"
                                ,400,"(!hasInlineeToBox)","!hasInlineeToBox");
    if (!bVar5) {
LAB_00d4eb76:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *(undefined4 *)slots.slotArray.ptr = 0;
  }
  Finish(this);
  JavascriptStackWalker::~JavascriptStackWalker((JavascriptStackWalker *)local_170);
  return;
}

Assistant:

void StackScriptFunction::BoxState::Box()
    {
        JavascriptStackWalker walker(scriptContext, true, returnAddress);
        JavascriptFunction * caller;
        bool hasInlineeToBox = false;
        while (walker.GetCaller(&caller))
        {
            if (!caller->IsScriptFunction())
            {
                continue;
            }

            ScriptFunction * callerScriptFunction = VarTo<ScriptFunction>(caller);
            FunctionBody * callerFunctionBody = callerScriptFunction->GetFunctionBody();
            if (hasInlineeToBox || this->NeedBoxFrame(callerFunctionBody))
            {
                // Box the frame display, but don't need to box the function unless we see them
                // in the slots.

                // If the frame display has any stack nested function, then it must have given to one of the
                // stack functions.  If it doesn't appear in  on eof the stack function , the frame display
                // doesn't contain any stack function
                InterpreterStackFrame * interpreterFrame = walker.GetCurrentInterpreterFrame();

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
                if (this->NeedBoxFrame(callerFunctionBody) || (hasInlineeToBox && !walker.IsInlineFrame()))
                {
                    char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
                    char16 const * frameKind;
                    if (interpreterFrame)
                    {
                        Assert(!hasInlineeToBox);
                        frameKind = walker.IsBailedOutFromInlinee()? _u("Interpreted from Inlined Bailout (Pending)") :
                            walker.IsBailedOutFromFunction()? _u("Interpreted from Bailout") : _u("Interpreted");
                    }
                    else if (walker.IsInlineFrame())
                    {
                        Assert(this->NeedBoxFrame(callerFunctionBody));
                        frameKind = _u("Native Inlined (Pending)");
                    }
                    else if (this->NeedBoxFrame(callerFunctionBody))
                    {
                        frameKind = (hasInlineeToBox? _u("Native and Inlinee") : _u("Native"));
                    }
                    else
                    {
                        frameKind = _u("Native for Inlinee");
                    }

                    PHASE_PRINT_TESTTRACE(Js::StackFuncPhase, callerFunctionBody,
                        _u("Boxing Frame [%s]: %s %s\n"), frameKind,
                        callerFunctionBody->GetDisplayName(), callerFunctionBody->GetDebugNumberSet(debugStringBuffer));
                }
#endif

                if (interpreterFrame)
                {
                    Assert(!hasInlineeToBox);

                    Assert(StackScriptFunction::GetCurrentFunctionObject(interpreterFrame->GetJavascriptFunction()) == caller);

                    if (callerFunctionBody->DoStackFrameDisplay() && interpreterFrame->IsClosureInitDone())
                    {
                        Js::FrameDisplay *stackFrameDisplay = interpreterFrame->GetLocalFrameDisplay();
                        // Local frame display may be null if bailout didn't restore it, which means we don't need it.
                        if (stackFrameDisplay)
                        {
                            Js::FrameDisplay *boxedFrameDisplay = this->BoxFrameDisplay(stackFrameDisplay);
                            interpreterFrame->SetLocalFrameDisplay(boxedFrameDisplay);
                        }
                    }
                    if (callerFunctionBody->DoStackScopeSlots() && interpreterFrame->IsClosureInitDone())
                    {
                        Field(Var)* stackScopeSlots = (Field(Var)*)interpreterFrame->GetLocalClosure();
                        if (stackScopeSlots)
                        {
                            // Scope slot pointer may be null if bailout didn't restore it, which means we don't need it.
                            Field(Var)* boxedScopeSlots = this->BoxScopeSlots(stackScopeSlots, static_cast<uint>(ScopeSlots(stackScopeSlots).GetCount()));
                            interpreterFrame->SetLocalClosure(boxedScopeSlots);
                        }
                    }

                    uint nestedCount = callerFunctionBody->GetNestedCount();
                    for (uint i = 0; i < nestedCount; i++)
                    {
                        // Box the stack function, even if they might not be "created" in the byte code yet.
                        // Some of them will not be captured in slots, so we just need to box them and record it with the
                        // stack func so that when we can just use the boxed value when we need it.
                        StackScriptFunction * stackFunction = interpreterFrame->GetStackNestedFunction(i);
                        ScriptFunction * boxedFunction = this->BoxStackFunction(stackFunction);
                        Assert(stackFunction->boxedScriptFunction == boxedFunction);
                        this->UpdateFrameDisplay(stackFunction);
                    }

                    if (walker.IsBailedOutFromInlinee())
                    {
                        if (!walker.IsCurrentPhysicalFrameForLoopBody())
                        {
                            // this is the interpret frame from bailing out of inline frame
                            // Just mark we have inlinee to box so we will walk the native frame's list when we get there.
                            hasInlineeToBox = true;
                        }
                    }
                    else if (walker.IsBailedOutFromFunction())
                    {
                        // The current interpret frame is from bailing out of a native frame.
                        // Walk native frame that was bailed out as well.
                        // The stack walker is pointing to the native frame already.
                        this->BoxNativeFrame(walker, callerFunctionBody);

                        // We don't need to box this frame, but we may still need to box the scope slot references
                        // within nested frame displays if the slots they refer to have been boxed.
                        if (callerFunctionBody->GetNestedCount() != 0)
                        {
                            this->ForEachStackNestedFunctionNative(walker, callerFunctionBody, [&](ScriptFunction *nestedFunc)
                            {
                                this->UpdateFrameDisplay(nestedFunc);
                            });
                        }
                    }
                }
                else
                {
                    if (walker.IsInlineFrame())
                    {
                        if (!walker.IsCurrentPhysicalFrameForLoopBody())
                        {
                            // We may have function that are not in slots.  So we have to walk the stack function list of the inliner
                            // to box all the needed function to catch those
                            hasInlineeToBox = true;
                        }
                    }
                    else
                    {
                        hasInlineeToBox = false;

                        if (callerFunctionBody->DoStackFrameDisplay())
                        {
                            Js::FrameDisplay *stackFrameDisplay =
                                this->GetFrameDisplayFromNativeFrame(walker, callerFunctionBody);
                            // Local frame display may be null if bailout didn't restore it, which means we don't need it.
                            if (stackFrameDisplay)
                            {
                                this->BoxFrameDisplay(stackFrameDisplay);
                            }
                        }
                        if (callerFunctionBody->DoStackScopeSlots())
                        {
                            Field(Var)* stackScopeSlots = (Field(Var)*)this->GetScopeSlotsFromNativeFrame(walker, callerFunctionBody);
                            if (stackScopeSlots)
                            {
                                // Scope slot pointer may be null if bailout didn't restore it, which means we don't need it.
                                this->BoxScopeSlots(stackScopeSlots, static_cast<uint>(ScopeSlots(stackScopeSlots).GetCount()));
                            }
                        }

                        // walk native frame
                        this->BoxNativeFrame(walker, callerFunctionBody);

                        // We don't need to box this frame, but we may still need to box the scope slot references
                        // within nested frame displays if the slots they refer to have been boxed.
                        if (callerFunctionBody->GetNestedCount() != 0)
                        {
                            this->ForEachStackNestedFunctionNative(walker, callerFunctionBody, [&](ScriptFunction *nestedFunc)
                            {
                                this->UpdateFrameDisplay(nestedFunc);
                            });
                        }
                    }
                }
            }
            else if (callerFunctionBody->DoStackFrameDisplay() && !walker.IsInlineFrame())
            {
                // The case here is that a frame need not be boxed, but the closure environment in that frame
                // refers to an outer boxed frame.
                // Find the FD and walk it looking for a slot array that refers to a FB that must be boxed.
                // Everything from that point outward must be boxed.
                FrameDisplay *frameDisplay;
                InterpreterStackFrame *interpreterFrame = walker.GetCurrentInterpreterFrame();
                bool closureInitDone = true; // Set to true as for native frame bailout will always restore the frameDisplay but for interpreter frame if PROBE_STACK fails closureInitDone won't have completed.

                if (interpreterFrame)
                {
                    frameDisplay = interpreterFrame->GetLocalFrameDisplay();
                    closureInitDone = interpreterFrame->IsClosureInitDone();
                }
                else
                {
                    frameDisplay = (Js::FrameDisplay*)walker.GetCurrentArgv()[
#if _M_IX86 || _M_AMD64
                        callerFunctionBody->GetInParamsCount() == 0 ?
                        JavascriptFunctionArgIndex_StackFrameDisplayNoArg :
#endif
                        JavascriptFunctionArgIndex_StackFrameDisplay];
                }
                if (ThreadContext::IsOnStack(frameDisplay) && closureInitDone)
                {
                    int i;
                    for (i = 0; i < frameDisplay->GetLength(); i++)
                    {
                        Field(Var) *slotArray = (Field(Var)*)frameDisplay->GetItem(i);

                        if (ScopeSlots::Is(slotArray))
                        {
                            ScopeSlots slots(slotArray);
                            if (!slots.IsDebuggerScopeSlotArray())
                            {
                                FunctionProxy *functionProxy = slots.GetFunctionInfo()->GetFunctionProxy();
                                if (functionProxy->IsFunctionBody() && this->NeedBoxFrame(functionProxy->GetFunctionBody()))
                                {
                                    break;
                                }
                            }
                        }
                    }
                    for (; i < frameDisplay->GetLength(); i++)
                    {
                        Field(Var) *pScope = (Field(Var)*)frameDisplay->GetItem(i);
                        if (ScopeSlots::Is(pScope))
                        {
                            Field(Var) *boxedSlots = this->BoxScopeSlots(pScope, static_cast<uint>(ScopeSlots(pScope).GetCount()));
                            frameDisplay->SetItem(i, boxedSlots);
                        }
                    }
                }
            }

            ScriptFunction * boxedCaller = nullptr;
            if (this->NeedBoxScriptFunction(callerScriptFunction))
            {
                // TODO-STACK-NESTED-FUNC: Can't assert this yet, JIT might not do stack func allocation
                // if the function hasn't been parsed or deserialized yet.
                // Assert(ThreadContext::IsOnStack(callerScriptFunction));
                if (ThreadContext::IsOnStack(callerScriptFunction))
                {
                    boxedCaller = this->BoxStackFunction(VarTo<StackScriptFunction>(callerScriptFunction));
                    walker.SetCurrentFunction(boxedCaller);

                    InterpreterStackFrame * interpreterFrame = walker.GetCurrentInterpreterFrame();
                    if (interpreterFrame)
                    {
                        interpreterFrame->SetExecutingStackFunction(boxedCaller);
                    }

                    // We don't need to box this frame, but we may still need to box the scope slot references
                    // within nested frame displays if the slots they refer to have been boxed.
                    if (callerFunctionBody->GetNestedCount() != 0)
                    {
                        this->ForEachStackNestedFunction(walker, callerFunctionBody, [&](ScriptFunction *nestedFunc)
                        {
                            this->UpdateFrameDisplay(nestedFunc);
                        });
                    }
                }
            }
        }

        Assert(!hasInlineeToBox);

        // We have to find one nested function
        this->Finish();
    }